

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmOrderDirectories.cxx
# Opt level: O2

void __thiscall
cmOrderDirectoriesConstraint::~cmOrderDirectoriesConstraint(cmOrderDirectoriesConstraint *this)

{
  this->_vptr_cmOrderDirectoriesConstraint =
       (_func_int **)&PTR__cmOrderDirectoriesConstraint_005e3610;
  std::__cxx11::string::~string((string *)&this->FileName);
  std::__cxx11::string::~string((string *)&this->Directory);
  std::__cxx11::string::~string((string *)&this->FullPath);
  return;
}

Assistant:

virtual ~cmOrderDirectoriesConstraint() = default;